

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O2

string_view mjs::trim(string_view *s)

{
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  size_type __n;
  size_t __pos;
  string_view sVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  
  sVar1 = s->_M_len;
  pcVar2 = s->_M_str;
  __pos = 0;
  sVar4 = sVar1;
  while (sVar4 != 0) {
    iVar3 = isblank((int)pcVar2[__pos]);
    if (iVar3 == 0) goto LAB_0011478a;
    __pos = __pos + 1;
    sVar4 = sVar4 - 1;
  }
  sVar4 = 0;
  __pos = sVar1;
LAB_0011478a:
  do {
    __n = sVar4;
    if (__n == 0) break;
    iVar3 = isblank((int)pcVar2[__n + (__pos - 1)]);
    sVar4 = __n - 1;
  } while (iVar3 != 0);
  bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr(s,__pos,__n);
  sVar6._M_len = bVar5._M_len;
  sVar6._M_str = bVar5._M_str;
  return sVar6;
}

Assistant:

std::string_view trim(const std::string_view& s) {
    size_t pos = 0, len = s.length();
    while (pos < s.length() && isblank(s[pos]))
        ++pos, --len;
    while (len && isblank(s[pos+len-1]))
        --len;
    return s.substr(pos, len);
}